

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_rust.cpp
# Opt level: O0

string * __thiscall
flatbuffers::rust::RustGenerator::GetEnumTypeForDecl_abi_cxx11_
          (string *__return_storage_ptr__,RustGenerator *this,Type *type)

{
  char *__s;
  allocator<char> local_35 [16];
  allocator<char> local_25;
  FullType local_24;
  Type *pTStack_20;
  FullType ft;
  Type *type_local;
  RustGenerator *this_local;
  
  pTStack_20 = type;
  type_local = (Type *)this;
  this_local = (RustGenerator *)__return_storage_ptr__;
  local_24 = anon_unknown_26::GetFullType(type);
  if ((local_24 != ftEnumKey) && (local_24 != ftUnionKey)) {
    __assert_fail("false && \"precondition failed in GetEnumTypeForDecl\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_rust.cpp"
                  ,0x279,
                  "std::string flatbuffers::rust::RustGenerator::GetEnumTypeForDecl(const Type &)");
  }
  if (pTStack_20->base_type == BASE_TYPE_BOOL) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"u8",&local_25);
    std::allocator<char>::~allocator(&local_25);
  }
  else {
    __s = GetEnumTypeForDecl::ctypename[pTStack_20->base_type];
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,__s,local_35);
    std::allocator<char>::~allocator(local_35);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GetEnumTypeForDecl(const Type &type) {
    const auto ft = GetFullType(type);
    if (!(ft == ftEnumKey || ft == ftUnionKey)) {
      FLATBUFFERS_ASSERT(false && "precondition failed in GetEnumTypeForDecl");
    }

    // clang-format off
    static const char *ctypename[] = {
    #define FLATBUFFERS_TD(ENUM, IDLTYPE, CTYPE, JTYPE, GTYPE, NTYPE, PTYPE, \
                           RTYPE, ...) \
      #RTYPE,
      FLATBUFFERS_GEN_TYPES(FLATBUFFERS_TD)
    #undef FLATBUFFERS_TD
    };
    // clang-format on

    // Enums can be bools, but their Rust representation must be a u8, as used
    // in the repr attribute (#[repr(bool)] is an invalid attribute).
    if (type.base_type == BASE_TYPE_BOOL) return "u8";
    return ctypename[type.base_type];
  }